

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_pstore::command_line::list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_pstore::command_line::list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>_&>
                  *this,list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
                        *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pMVar2;
  pointer pMVar3;
  undefined1 uVar4;
  bool bVar5;
  int iVar6;
  MatchResultListener *pMVar7;
  bool bVar8;
  size_t count;
  _List_node_base *p_Var9;
  long lVar10;
  list<(anonymous_namespace)::enumeration,_std::allocator<(anonymous_namespace)::enumeration>_>
  *plVar11;
  long lVar12;
  size_t sVar13;
  pointer pbVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  long *local_1e8 [2];
  long local_1d8 [2];
  undefined1 local_1c8 [32];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_1c8);
  p_Var9 = (container->values_).
           super__List_base<(anonymous_namespace)::enumeration,_std::allocator<(anonymous_namespace)::enumeration>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  plVar11 = &container->values_;
  if (p_Var9 == (_List_node_base *)plVar11) {
    count = 0;
    uVar4 = false;
    sVar13 = count;
  }
  else {
    lVar10 = 0;
    lVar12 = 0;
    count = 0;
    do {
      pMVar2 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (count == ((long)(this->matchers_).
                          super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
                   -0x5555555555555555) break;
      if (poVar1 == (ostream *)0x0) {
        local_1c8._8_8_ = (ostream *)0x0;
        local_1c8._0_8_ = &PTR__MatchResultListener_001ac580;
        bVar5 = MatcherBase<const_(anonymous_namespace)::enumeration_&>::MatchAndExplain
                          ((MatcherBase<const_(anonymous_namespace)::enumeration_&> *)
                           ((long)&(pMVar2->
                                   super_MatcherBase<const_(anonymous_namespace)::enumeration_&>).
                                   super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                           lVar12),(enumeration *)(p_Var9 + 1),(MatchResultListener *)local_1c8);
      }
      else {
        local_1c8._8_8_ = local_1a8;
        local_1c8._0_8_ = &PTR__StringMatchResultListener_001ac5c8;
        std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
        bVar5 = MatcherBase<const_(anonymous_namespace)::enumeration_&>::MatchAndExplain
                          ((MatcherBase<const_(anonymous_namespace)::enumeration_&> *)
                           ((long)&(((this->matchers_).
                                     super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_MatcherBase<const_(anonymous_namespace)::enumeration_&>).
                                   super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                           lVar12),(enumeration *)(p_Var9 + 1),(MatchResultListener *)local_1c8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((local_200.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10)
                   ,(string *)local_1e8);
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        local_1c8._0_8_ = &PTR__StringMatchResultListener_001ac5c8;
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
        std::ios_base::~ios_base(local_138);
      }
      if (!bVar5) {
        uVar4 = true;
        sVar13 = count;
        goto joined_r0x0012a004;
      }
      count = count + 1;
      p_Var9 = p_Var9->_M_next;
      lVar12 = lVar12 + 0x18;
      lVar10 = lVar10 + 0x20;
    } while (p_Var9 != (_List_node_base *)plVar11);
    uVar4 = false;
    sVar13 = count;
  }
joined_r0x0012a004:
  for (; p_Var9 != (_List_node_base *)plVar11; p_Var9 = p_Var9->_M_next) {
    count = count + 1;
  }
  pMVar2 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (count == ((long)pMVar3 - (long)pMVar2 >> 3) * -0x5555555555555555) {
    if (!(bool)uVar4) {
      bVar5 = true;
      if (pMVar3 != pMVar2 && poVar1 != (ostream *)0x0) {
        lVar12 = 8;
        bVar8 = false;
        lVar10 = 0;
        do {
          pbVar14 = local_200.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&((local_200.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar12) != 0) {
            if (bVar8) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar7 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            if (pMVar7->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar7->stream_);
            }
            pMVar7 = MatchResultListener::operator<<(pMVar7,(char (*) [11])" matches, ");
            bVar8 = true;
            if (pMVar7->stream_ != (ostream *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar7->stream_,*(char **)((long)pbVar14 + lVar12 + -8),
                         *(long *)((long)&(pbVar14->_M_dataplus)._M_p + lVar12));
            }
          }
          lVar10 = lVar10 + 1;
          lVar12 = lVar12 + 0x20;
        } while (lVar10 != ((long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
      }
      goto LAB_0012a12a;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar7 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar7->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar7->stream_);
      }
      MatchResultListener::operator<<(pMVar7,(char (*) [15])" doesn\'t match");
      pbVar14 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + sVar13;
      poVar1 = listener->stream_;
      iVar6 = std::__cxx11::string::compare((char *)pbVar14);
      bVar5 = false;
      if ((poVar1 == (ostream *)0x0) || (bVar5 = false, iVar6 == 0)) goto LAB_0012a12a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
    }
  }
  else if (count != 0 && poVar1 != (ostream *)0x0) {
    pMVar7 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_pstore::command_line::list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>_&>
              *)local_1c8,count);
    MatchResultListener::operator<<(pMVar7,(Message *)local_1c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1c8._0_8_ !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_1c8._0_8_ + 8))();
    }
  }
  bVar5 = false;
LAB_0012a12a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return bVar5;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }